

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeedForwardNN.h
# Opt level: O2

void __thiscall
nnad::FeedForwardNN<double>::FeedForwardNN
          (FeedForwardNN<double> *this,vector<int,_std::allocator<int>_> *Arch,int *RandomSeed,
          bool *Report,function<double_(const_double_&)> *ActFun,
          function<double_(const_double_&)> *dActFun,OutputFunction *OutputFunc,
          Preprocessing *Preproc,vector<double,_std::allocator<double>_> *PreprocPars)

{
  _Rb_tree_header *p_Var1;
  vector<double,_std::allocator<double>_> *this_00;
  OutputFunction OVar2;
  pointer piVar3;
  pointer piVar4;
  int *piVar5;
  int iVar6;
  reference pvVar7;
  ulong uVar8;
  ostream *poVar9;
  _Head_base<3UL,_int,_false> __val;
  long lVar10;
  int l;
  int iVar11;
  _Head_base<3UL,_int,_false> _Var12;
  size_type __n;
  int *n;
  long lVar13;
  int *piVar14;
  vector<int,_std::allocator<int>_> *__range3;
  undefined1 local_1f8 [8];
  undefined1 local_1f0 [8];
  undefined1 local_1e8 [16];
  _Tuple_impl<3UL,_int> local_1d8;
  _Head_base<2UL,_int,_false> local_1d4;
  _Head_base<1UL,_int,_false> local_1d0;
  _Head_base<0UL,_bool,_false> local_1cc;
  ulong local_1c8;
  long local_1c0;
  function<double_(const_double_&)> *local_1b8;
  function<double_(const_double_&)> *local_1b0;
  _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  *local_1a8;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>>
  *local_1a0;
  _Rb_tree<int,std::pair<int_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<int_const,std::tuple<bool,int,int,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::tuple<bool,int,int,int>>>>
  *local_198;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  *local_190;
  string name_1;
  string name;
  vector<int,_std::allocator<int>_> sub_seeds;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::vector<int,_std::allocator<int>_>::vector(&this->_Arch,Arch);
  std::function<double_(const_double_&)>::function(&this->_ActFun,ActFun);
  std::function<double_(const_double_&)>::function(&this->_dActFun,dActFun);
  this->_OutputFunc = *OutputFunc;
  std::
  function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  ::function(&this->_Preproc,Preproc);
  this_00 = &this->_PreprocPars;
  if ((this->_Preproc).super__Function_base._M_manager == (_Manager_type)0x0) {
    (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (this->_PreprocPars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->_PreprocPars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar11 = 0;
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector(this_00,PreprocPars);
    iVar11 = (int)((ulong)((long)(this->_PreprocPars).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(this->_PreprocPars).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3);
  }
  this->_NpPrep = iVar11;
  (this->_Links)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_Links)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1b0 = &this->_OutputActFun;
  p_Var1 = &(this->_Links)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->_OutputActFun).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_OutputActFun).super__Function_base._M_functor + 8) = 0;
  (this->_OutputActFun).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_OutputActFun)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->_dOutputActFun).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_dOutputActFun).super__Function_base._M_functor + 8) = 0;
  (this->_dOutputActFun).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_dOutputActFun)._M_invoker = (_Invoker_type)0x0;
  (this->_Links)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_Links)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_Links)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b8 = &this->_dOutputActFun;
  (this->_Biases)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_Biases)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->_Biases)._M_t._M_impl.super__Rb_tree_header;
  (this->_Biases)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_Biases)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_Biases)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_198 = (_Rb_tree<int,std::pair<int_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<int_const,std::tuple<bool,int,int,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::tuple<bool,int,int,int>>>>
               *)&this->_IntMap;
  p_Var1 = &(this->_IntMap)._M_t._M_impl.super__Rb_tree_header;
  (this->_IntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_IntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_IntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_IntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_IntMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_StrMap)._M_t._M_impl.super__Rb_tree_header;
  (this->_StrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_StrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_StrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_StrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_StrMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_StrIntMap)._M_t._M_impl.super__Rb_tree_header;
  (this->_StrIntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_StrIntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_StrIntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_StrIntMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_StrIntMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>>
               *)&this->_StrMap;
  (this->_IntStrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_190 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
               *)&this->_StrIntMap;
  (this->_IntStrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a8 = (_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
               *)&this->_IntStrMap;
  p_Var1 = &(this->_IntStrMap)._M_t._M_impl.super__Rb_tree_header;
  (this->_IntStrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_IntStrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_IntStrMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  piVar3 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar4 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  srand(*RandomSeed);
  sub_seeds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sub_seeds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  sub_seeds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  for (iVar11 = 1; iVar6 = (int)((ulong)((long)piVar3 - (long)piVar4) >> 2), iVar11 < iVar6;
      iVar11 = iVar11 + 1) {
    iVar6 = rand();
    local_1f8._0_4_ = iVar6;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&sub_seeds,(int *)local_1f8);
    local_1f8._0_4_ = rand();
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&sub_seeds,(int *)local_1f8);
  }
  this->_Np = 0;
  lVar13 = 4;
  __n = 0;
  for (lVar10 = 1; lVar10 < iVar6; lVar10 = lVar10 + 1) {
    piVar3 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar7 = std::vector<int,_std::allocator<int>_>::at(&sub_seeds,__n);
    Matrix<double>::Matrix
              ((Matrix<double> *)&name,(int *)((long)piVar3 + lVar13),
               (int *)((long)piVar3 + lVar13 + -4),pvVar7);
    local_1f8._0_4_ = (int)lVar10;
    Matrix<double>::Matrix((Matrix<double> *)local_1f0,(Matrix<double> *)&name);
    std::
    _Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
    ::_M_insert_unique<std::pair<int_const,nnad::Matrix<double>>>
              ((_Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
                *)&this->_Links,(pair<const_int,_nnad::Matrix<double>_> *)local_1f8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_1e8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&name._M_string_length);
    piVar3 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    name_1._M_dataplus._M_p._0_4_ = 1;
    pvVar7 = std::vector<int,_std::allocator<int>_>::at(&sub_seeds,__n + 1);
    Matrix<double>::Matrix
              ((Matrix<double> *)&name,(int *)((long)piVar3 + lVar13),(int *)&name_1,pvVar7);
    local_1f8._0_4_ = (int)lVar10;
    Matrix<double>::Matrix((Matrix<double> *)local_1f0,(Matrix<double> *)&name);
    std::
    _Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
    ::_M_insert_unique<std::pair<int_const,nnad::Matrix<double>>>
              ((_Rb_tree<int,std::pair<int_const,nnad::Matrix<double>>,std::_Select1st<std::pair<int_const,nnad::Matrix<double>>>,std::less<int>,std::allocator<std::pair<int_const,nnad::Matrix<double>>>>
                *)&this->_Biases,(pair<const_int,_nnad::Matrix<double>_> *)local_1f8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_1e8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&name._M_string_length);
    piVar3 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    this->_Np = this->_Np +
                (*(int *)((long)piVar3 + __n * 2) + 1) * *(int *)((long)piVar3 + __n * 2 + 4);
    lVar13 = lVar13 + 4;
    __n = __n + 2;
  }
  uVar8 = 0;
  lVar10 = (long)iVar6;
  while (lVar13 = lVar10, 1 < lVar13) {
    local_1c0 = lVar13 + -1;
    iVar11 = 0;
    local_1c8 = uVar8;
    while( true ) {
      uVar8 = local_1c8;
      lVar10 = local_1c0;
      if ((this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[local_1c0] <= iVar11) break;
      std::__cxx11::to_string(&local_d0,(int)local_1c0);
      std::operator+(&name_1,"B_",&local_d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &name_1,"_");
      std::__cxx11::to_string(&local_f0,iVar11);
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1f8,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&name_1);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::string((string *)local_1f8,(string *)&name);
      uVar8 = local_1c8;
      local_1d8.super__Head_base<3UL,_int,_false>._M_head_impl = SUB84(local_1c8,0);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,int>>
                (local_190,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      local_1f8 = (undefined1  [8])(uVar8 & 0xffffffff);
      iVar6 = (int)local_1c0;
      local_1e8[0] = '\0';
      local_1f0._0_4_ = iVar11;
      local_1f0._4_4_ = iVar6;
      std::
      _Rb_tree<int,std::pair<int_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<int_const,std::tuple<bool,int,int,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::tuple<bool,int,int,int>>>>
      ::_M_insert_unique<std::pair<int_const,std::tuple<bool,int,int,int>>>
                (local_198,(pair<const_int,_std::tuple<bool,_int,_int,_int>_> *)local_1f8);
      std::__cxx11::string::string((string *)local_1f8,(string *)&name);
      local_1d8.super__Head_base<3UL,_int,_false>._M_head_impl = (_Head_base<3UL,_int,_false>)0;
      local_1cc._M_head_impl = false;
      local_1d4._M_head_impl = iVar11;
      local_1d0._M_head_impl = iVar6;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>
                (local_1a0,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>
                  *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      local_1f8._0_4_ = (int)local_1c8;
      std::__cxx11::string::string((string *)local_1f0,(string *)&name);
      std::
      _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
      ::_M_insert_unique<std::pair<int_const,std::__cxx11::string>>
                (local_1a8,
                 (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f0);
      iVar6 = (int)local_1c8;
      for (__val._M_head_impl = 0;
          __val._M_head_impl <
          (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar13 + -2]; __val._M_head_impl = __val._M_head_impl + 1
          ) {
        std::__cxx11::to_string(&local_90,(int)local_1c0);
        std::operator+(&local_70,"L_",&local_90);
        std::operator+(&local_f0,&local_70,"_");
        std::__cxx11::to_string(&local_b0,iVar11);
        std::operator+(&local_d0,&local_f0,&local_b0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8,&local_d0,"_");
        std::__cxx11::to_string(&local_50,__val._M_head_impl);
        std::operator+(&name_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)local_1f8);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::string((string *)local_1f8,(string *)&name_1);
        _Var12._M_head_impl = iVar6 + 1 + __val._M_head_impl;
        local_1d8.super__Head_base<3UL,_int,_false>._M_head_impl =
             (_Head_base<3UL,_int,_false>)(_Head_base<3UL,_int,_false>)_Var12._M_head_impl;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string_const,int>>
                  (local_190,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                    *)local_1f8);
        std::__cxx11::string::~string((string *)local_1f8);
        local_1f0._4_4_ = (undefined4)local_1c0;
        local_1e8[0] = '\x01';
        local_1f0._0_4_ = iVar11;
        local_1f8._0_4_ = _Var12._M_head_impl;
        local_1f8._4_4_ = __val._M_head_impl;
        std::
        _Rb_tree<int,std::pair<int_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<int_const,std::tuple<bool,int,int,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::tuple<bool,int,int,int>>>>
        ::_M_insert_unique<std::pair<int_const,std::tuple<bool,int,int,int>>>
                  (local_198,(pair<const_int,_std::tuple<bool,_int,_int,_int>_> *)local_1f8);
        std::__cxx11::string::string((string *)local_1f8,(string *)&name_1);
        local_1d0._M_head_impl = (int)local_1c0;
        local_1cc._M_head_impl = true;
        local_1d8.super__Head_base<3UL,_int,_false>._M_head_impl =
             (_Head_base<3UL,_int,_false>)(_Head_base<3UL,_int,_false>)__val._M_head_impl;
        local_1d4._M_head_impl = iVar11;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::tuple<bool,int,int,int>>>
                  (local_1a0,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>
                    *)local_1f8);
        std::__cxx11::string::~string((string *)local_1f8);
        local_1f8._0_4_ = _Var12._M_head_impl;
        std::__cxx11::string::string((string *)local_1f0,(string *)&name_1);
        std::
        _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
        ::_M_insert_unique<std::pair<int_const,std::__cxx11::string>>
                  (local_1a8,
                   (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1f8);
        std::__cxx11::string::~string((string *)local_1f0);
        std::__cxx11::string::~string((string *)&name_1);
      }
      std::__cxx11::string::~string((string *)&name);
      iVar11 = iVar11 + 1;
      local_1c8 = (ulong)((int)local_1c8 + __val._M_head_impl + 1);
    }
  }
  OVar2 = this->_OutputFunc;
  if (OVar2 == ACTIVATION) {
    std::function<double_(const_double_&)>::operator=(local_1b0,&this->_ActFun);
    std::function<double_(const_double_&)>::operator=(local_1b8,&this->_dActFun);
  }
  else if (OVar2 == LINEAR) {
    std::function<double(double_const&)>::operator=
              ((function<double(double_const&)> *)local_1b0,(anon_class_1_0_00000001 *)local_1f8);
    std::function<double(double_const&)>::operator=
              ((function<double(double_const&)> *)local_1b8,(anon_class_1_0_00000001 *)local_1f8);
  }
  else if (OVar2 == QUADRATIC) {
    std::function<double(double_const&)>::operator=
              ((function<double(double_const&)> *)local_1b0,(anon_class_1_0_00000001 *)local_1f8);
    std::function<double(double_const&)>::operator=
              ((function<double(double_const&)> *)local_1b8,(anon_class_1_0_00000001 *)local_1f8);
  }
  if ((this->_Preproc).super__Function_base._M_manager != (_Manager_type)0x0) {
    name._M_dataplus._M_p = (pointer)0x0;
    name._M_string_length = 0;
    name.field_2._M_allocated_capacity = 0;
    for (iVar11 = 0;
        iVar11 < *(this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; iVar11 = iVar11 + 1) {
      iVar6 = rand();
      local_1f8 = (undefined1  [8])((double)(iVar6 % 100) * 0.01);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)&name,(double *)local_1f8);
    }
    std::
    function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
    ::operator()((vector<double,_std::allocator<double>_> *)&name_1,&this->_Preproc,
                 (vector<double,_std::allocator<double>_> *)&name,this_00);
    if ((this->_NpPrep + 1) *
        (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1] !=
        (int)(name_1._M_string_length -
              CONCAT44(name_1._M_dataplus._M_p._4_4_,name_1._M_dataplus._M_p._0_4_) >> 3)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1f8,"FeedForwardNN: preprocessing function not well-formed.",
                 (allocator<char> *)&local_d0);
      Error((string *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&name_1);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&name);
  }
  if (*Report == true) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\nFeed-forward neural network initialised:");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&std::cout,"- architecture = [ ");
    piVar5 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar14 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; piVar14 != piVar5; piVar14 = piVar14 + 1) {
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar14);
      std::operator<<(poVar9," ");
    }
    poVar9 = std::operator<<((ostream *)&std::cout,"]");
    std::endl<char,std::char_traits<char>>(poVar9);
    if ((this->_Preproc).super__Function_base._M_manager == (_Manager_type)0x0) {
      poVar9 = std::operator<<((ostream *)&std::cout,"- number of parameters = ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->_Np);
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cout,"- preprocessing function provided");
      std::endl<char,std::char_traits<char>>(poVar9);
      poVar9 = std::operator<<((ostream *)&std::cout,
                               "- number of parameters (NN + preprocessing) = ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->_Np);
      poVar9 = std::operator<<(poVar9," + ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->_NpPrep);
      poVar9 = std::operator<<(poVar9," (");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->_NpPrep + this->_Np);
      poVar9 = std::operator<<(poVar9,")");
    }
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&std::cout,"- NN output function: ");
    if ((ulong)this->_OutputFunc < 3) {
      poVar9 = std::operator<<((ostream *)&std::cout,
                               &DAT_00107080 +
                               *(int *)(&DAT_00107080 + (ulong)this->_OutputFunc * 4));
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cout,"unknown");
      std::endl<char,std::char_traits<char>>(poVar9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1f8,"FeedForwardNN: Unknown output function.",
                 (allocator<char> *)&name);
      Error((string *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
    }
    std::operator<<((ostream *)&std::cout,"\n");
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sub_seeds.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

FeedForwardNN(std::vector<int>           const& Arch,
                  int                        const& RandomSeed,
                  bool                       const& Report = false,
                  std::function<T(T const&)> const& ActFun = Sigmoid<T>,
                  std::function<T(T const&)> const& dActFun = dSigmoid<T>,
                  OutputFunction             const& OutputFunc = LINEAR,
                  Preprocessing              const& Preproc = nullptr,
                  std::vector<T>             const& PreprocPars = {}):
      _Arch(Arch),
      _ActFun(ActFun),
      _dActFun(dActFun),
      _OutputFunc(OutputFunc),
      _Preproc(Preproc),
      _PreprocPars(_Preproc == nullptr ? std::vector<T> {} : PreprocPars),
      _NpPrep((int) _PreprocPars.size())
    {
      // Number of layers
      const int nl = (int) _Arch.size();

      // Store sub seeds
      srand(RandomSeed);
      std::vector<int> sub_seeds;
      for (int l = 1; l < nl; l++)
        {
          sub_seeds.push_back(rand());
          sub_seeds.push_back(rand());
        }

      // Number of parameters of the NN
      _Np = 0;

      // Initialise links and biases with random numbers. Links are
      // treated as matrices that connect consecutive layers with as
      // many rows as nodes of the rightmost layer and as many columns
      // as the leftmost layer. Biases are treated as one-column
      // matrices associated to each layer (but the input one) with as
      // many rows as nodes.
      int iseed = 0;
      for (int l = 1; l < nl; l++)
        {
          _Links.insert({l, Matrix<T>{_Arch[l], _Arch[l - 1], sub_seeds.at(iseed++)}});
          _Biases.insert({l, Matrix<T>{_Arch[l], 1, sub_seeds.at(iseed++)}});
          _Np += _Arch[l] * (_Arch[l - 1] + 1);
        }

      // Construct maps that index the free parameters. Each parameter is
      // associated to an integer and a string.
      int count = 0;
      for (int l = nl - 1; l > 0; l--)
        for (int i = 0; i < _Arch[l]; i++)
          {
            // Biases
            const coordinates coord = std::make_tuple(false, l, i, 0);
            const std::string name = "B_" + std::to_string(l) + "_" + std::to_string(i);
            _StrIntMap.insert({name, count});
            _IntMap.insert({count, coord});
            _StrMap.insert({name, coord});
            _IntStrMap.insert({count++, name});

            // Links
            for (int j = 0; j < _Arch[l - 1]; j++)
              {
                const coordinates coord = std::make_tuple(true, l, i, j);
                const std::string name = "L_" + std::to_string(l) + "_" + std::to_string(i) + "_" + std::to_string(j);
                _StrIntMap.insert({name, count});
                _IntMap.insert({count, coord});
                _StrMap.insert({name, coord});
                _IntStrMap.insert({count++, name});
              }
          }

      // Define activation function of the output nodes and its
      // derivative.
      switch (_OutputFunc)
        {
        case ACTIVATION:
          _OutputActFun  = _ActFun;
          _dOutputActFun = _dActFun;
          break;
        case LINEAR:
          _OutputActFun  = [] (T const& x) -> T { return x; };
          _dOutputActFun = [] (T const&)   -> T { return T{1}; };
          break;
        case QUADRATIC:
          _OutputActFun  = [] (T const& x) -> T { return x * x; };
          _dOutputActFun = [] (T const& x) -> T { return 2 * x; };
          break;
        }

      // Check sanity of preprocessing function, if present
      if (_Preproc != nullptr)
        {
          // Generate random inputs between 0 and 1 but recasted as T
          std::vector<T> InPrep;
          for (int i = 0; i < _Arch.front(); i++)
            InPrep.push_back(T{1e-2 * ( rand() % 100 )});

          // Test preprocessing function
          const std::vector<T> OutPrep = _Preproc(InPrep, _PreprocPars);

          // Check that the number of outputs of the preprocessing
          // function is the same as that of the NN.
          if ((int) OutPrep.size() != ( _NpPrep + 1 ) * _Arch.back())
            Error("FeedForwardNN: preprocessing function not well-formed.");
        }

      // Report NN parameters
      if (Report)
        {
          std::cout << "\nFeed-forward neural network initialised:" << std::endl;
          std::cout << "- architecture = [ ";
          for (auto const& n : _Arch)
            std::cout << n << " ";
          std::cout << "]" << std::endl;
          if (_Preproc != nullptr)
            {
              std::cout << "- preprocessing function provided" << std::endl;
              std::cout << "- number of parameters (NN + preprocessing) = " << _Np << " + " << _NpPrep << " (" << _Np + _NpPrep << ")" << std::endl;
            }
          else
            std::cout << "- number of parameters = " << _Np << std::endl;
          std::cout << "- NN output function: ";
          switch (_OutputFunc)
            {
            case ACTIVATION:
              std::cout << "activation-like" << std::endl;
              break;
            case LINEAR:
              std::cout << "linear" << std::endl;
              break;
            case QUADRATIC:
              std::cout << "quadratic" << std::endl;
              break;
            default:
              std::cout << "unknown" << std::endl;
              Error("FeedForwardNN: Unknown output function.");
            }
          std::cout << "\n";
        }
    }